

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * __thiscall
fmt::v11::detail::do_format_decimal<char,unsigned__int128>
          (detail *this,char *out,unsigned___int128 value,int size)

{
  ulong uVar1;
  undefined8 in_RAX;
  ulong in_RCX;
  undefined4 in_register_00000014;
  ulong uVar2;
  undefined8 unaff_RBX;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  
  uVar2 = CONCAT44(in_register_00000014,size);
  uVar5 = in_RCX & 0xffffffff;
  uVar4 = (uint)in_RCX;
  auVar9._8_8_ = unaff_RBX;
  auVar9._0_8_ = in_RAX;
  count_digits_fallback<unsigned__int128>((detail *)out,(unsigned___int128)auVar9);
  pcVar3 = out;
  uVar6 = uVar2;
  if ((out < (char *)0x64) <= uVar2) {
    do {
      uVar4 = (int)uVar5 - 2;
      uVar5 = (ulong)uVar4;
      auVar9 = __udivti3(pcVar3,uVar6,100,0);
      uVar2 = auVar9._8_8_;
      out = auVar9._0_8_;
      *(undefined2 *)(this + uVar5) =
           *(undefined2 *)(digits2(unsigned_long)::data + (long)(pcVar3 + (long)out * -100) * 2);
      bVar7 = (char *)0x270f < pcVar3;
      bVar8 = uVar6 != 0;
      uVar1 = -uVar6;
      pcVar3 = out;
      uVar6 = uVar2;
    } while (bVar8 || uVar1 < bVar7);
  }
  if (uVar2 < (out < (char *)0xa)) {
    uVar6 = (ulong)(uVar4 - 1);
    this[uVar6] = (detail)((byte)out | 0x30);
  }
  else {
    uVar6 = (ulong)(uVar4 - 2);
    *(undefined2 *)(this + uVar6) = *(undefined2 *)(digits2(unsigned_long)::data + (long)out * 2);
  }
  return (char *)(this + uVar6);
}

Assistant:

FMT_CONSTEXPR20 auto do_format_decimal(Char* out, UInt value, int size)
    -> Char* {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  unsigned n = to_unsigned(size);
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    n -= 2;
    write2digits(out + n, static_cast<unsigned>(value % 100));
    value /= 100;
  }
  if (value >= 10) {
    n -= 2;
    write2digits(out + n, static_cast<unsigned>(value));
  } else {
    out[--n] = static_cast<Char>('0' + value);
  }
  return out + n;
}